

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::RestoreState(FlagImpl *this,FlagState *flag_state)

{
  long lVar1;
  FlagValueStorageKind FVar2;
  Mutex *mu;
  int64_t iVar3;
  MutexLock local_28;
  MutexLock l;
  FlagState *flag_state_local;
  FlagImpl *this_local;
  
  l.mu_ = (Mutex *)flag_state;
  mu = DataGuard(this);
  MutexLock::MutexLock(&local_28,mu);
  lVar1 = l.mu_[4].mu_.super___atomic_base<long>._M_i;
  iVar3 = ModificationCount(this);
  if (lVar1 == iVar3) {
    this_local._7_1_ = false;
  }
  else {
    FVar2 = ValueStorageKind(this);
    if (FVar2 < kSequenceLocked) {
      StoreValue(this,l.mu_ + 2,kProgrammaticChange);
    }
    else if ((byte)(FVar2 - kSequenceLocked) < 2) {
      StoreValue(this,(void *)l.mu_[2].mu_.super___atomic_base<long>._M_i,kProgrammaticChange);
    }
    this->field_0x29 =
         this->field_0x29 & 0xfb | ((byte)l.mu_[3].mu_.super___atomic_base<long>._M_i & 1) << 2;
    this->field_0x29 =
         this->field_0x29 & 0xf7 |
         (*(byte *)((long)&l.mu_[3].mu_.super___atomic_base<long>._M_i + 1) & 1) << 3;
    this_local._7_1_ = true;
  }
  MutexLock::~MutexLock(&local_28);
  return this_local._7_1_;
}

Assistant:

bool FlagImpl::RestoreState(const FlagState& flag_state) {
  absl::MutexLock l(DataGuard());
  if (flag_state.counter_ == ModificationCount()) {
    return false;
  }

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic:
      StoreValue(&flag_state.value_.one_word, kProgrammaticChange);
      break;
    case FlagValueStorageKind::kSequenceLocked:
    case FlagValueStorageKind::kHeapAllocated:
      StoreValue(flag_state.value_.heap_allocated, kProgrammaticChange);
      break;
  }

  modified_ = flag_state.modified_;
  on_command_line_ = flag_state.on_command_line_;

  return true;
}